

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O3

bool __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckSolution(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ArrayRef<double> *x,ValueMapDbl *duals,ArrayRef<double> *obj,void *p_extra)

{
  pointer *ppdVar1;
  long lVar2;
  uint uVar3;
  size_type sVar4;
  char *__s;
  long *plVar6;
  Error *pEVar7;
  size_type *psVar8;
  bool bVar9;
  string local_2f0;
  ArrayRef<double> x1;
  string msgreal;
  string err_msg;
  string msgidea;
  vector<double,_std::allocator<double>_> x_back;
  vector<bool,_std::allocator<bool>_> local_228;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  ArrayRef<double> local_178;
  ArrayRef<double> local_148;
  ArrayRef<double> local_118;
  ArrayRef<double> local_e8;
  ArrayRef<double> local_b8;
  ArrayRef<double> local_88;
  ArrayRef<double> local_58;
  size_type sVar5;
  
  if ((p_extra != (void *)0x0) &&
     (this[7].recomp_fn.super__Function_base._M_functor._M_pod_data[4] != '\x01')) {
    return true;
  }
  msgreal._M_dataplus._M_p = (pointer)&msgreal.field_2;
  msgreal._M_string_length = 0;
  msgreal.field_2._M_local_buf[0] = '\0';
  msgidea._M_dataplus._M_p = (pointer)&msgidea.field_2;
  msgidea._M_string_length = 0;
  msgidea.field_2._M_local_buf[0] = '\0';
  err_msg._M_dataplus._M_p = (pointer)&err_msg.field_2;
  err_msg._M_string_length = 0;
  err_msg.field_2._M_local_buf[0] = '\0';
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&x_back,x->data_,x->data_ + x->size_,
             (allocator_type *)&x1);
  uVar3 = *(uint *)&this[7].recomp_fn.super__Function_base._M_functor;
  if ((uVar3 & 0x1f) != 0) {
    local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.data_ = x->data_;
    local_58.size_ = x->size_;
    local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.data_ = obj->data_;
    local_88.size_ = obj->size_;
    local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.data_ = (double *)0x0;
    local_b8.size_ = 0;
    SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::DoCheckSol_abi_cxx11_((string *)&x1,this,&local_58,duals,&local_88,&local_b8,&x_back,false);
    std::__cxx11::string::operator=((string *)&msgreal,(string *)&x1);
    if ((pointer *)
        x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        &x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar3 = *(uint *)&this[7].recomp_fn.super__Function_base._M_functor;
  }
  if ((uVar3 & 0x3e0) != 0) {
    local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.data_ = x->data_;
    local_e8.size_ = x->size_;
    local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 0;
    local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = 0;
    local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    RecomputeAuxVars(&x1,this,&local_e8,&local_228);
    if (local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ =
           local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_118.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.data_ = x1.data_;
    local_118.size_ = x1.size_;
    local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.data_ = obj->data_;
    local_148.size_ = obj->size_;
    local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.data_ =
         x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_178.size_ =
         (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
    SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::DoCheckSol_abi_cxx11_(&local_2f0,this,&local_118,duals,&local_148,&local_178,&x_back,true);
    std::__cxx11::string::operator=((string *)&msgidea,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.save_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (msgidea._M_string_length != 0 || msgreal._M_string_length != 0) {
    ppdVar1 = &x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&x1,"Type                         MaxAbs [Name]   MaxRel [Name]\n","");
    std::__cxx11::string::_M_append((char *)&x1,(ulong)msgidea._M_dataplus._M_p);
    sVar5 = msgreal._M_string_length;
    if (msgreal._M_string_length != 0) {
      while (sVar4 = sVar5 - 1, sVar4 != 0) {
        lVar2 = sVar5 - 2;
        sVar5 = sVar4;
        if ((msgreal._M_dataplus._M_p[lVar2] == '\n') && (msgreal._M_dataplus._M_p[sVar4] == ' ')) {
          msgreal._M_dataplus._M_p[sVar4] = '*';
        }
      }
      if (*msgreal._M_dataplus._M_p == ' ') {
        *msgreal._M_dataplus._M_p = '*';
      }
      std::__cxx11::string::_M_append((char *)&x1,(ulong)msgreal._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&x1);
    }
    std::__cxx11::string::append((char *)&x1);
    if (this[7].recomp_fn.super__Function_base._M_functor._M_pod_data[5] == '\x01') {
      pEVar7 = (Error *)__cxa_allocate_exception(0x18);
      std::operator+(&local_2f0,"Solution check failed - reporting as fatal:\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x1);
      Error::Error(pEVar7,(CStringRef)local_2f0._M_dataplus._M_p,0x96);
      __cxa_throw(pEVar7,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    __s = BasicSolver::GetSolCheckWarningKey
                    (*(BasicSolver **)&this[1].recomp_fn.super__Function_base._M_functor,true);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,__s,(allocator<char> *)&local_2f0);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,
               x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish +
               (long)x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)&this[-0x13].recomp_fn.super__Function_base._M_manager,&local_198,&local_1b8,
                 true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != ppdVar1) {
      operator_delete(x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)x1.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (err_msg._M_string_length == 0) {
    if (msgreal._M_string_length == 0) {
      bVar9 = msgidea._M_string_length == 0;
      goto LAB_001668ed;
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x_back,'\n'
                   ,&msgreal);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&x_back,(ulong)msgidea._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2f0.field_2._M_allocated_capacity = *psVar8;
      local_2f0.field_2._8_8_ = plVar6[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar8;
      local_2f0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_msg,(ulong)local_2f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer *)
        x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)x_back.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (this[7].recomp_fn.super__Function_base._M_functor._M_pod_data[5] == '\x01') {
      pEVar7 = (Error *)__cxa_allocate_exception(0x18);
      std::operator+(&local_2f0,"Solution check aborted: ",&err_msg);
      Error::Error(pEVar7,(CStringRef)local_2f0._M_dataplus._M_p,-1);
      __cxa_throw(pEVar7,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"Solution check aborted","");
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,err_msg._M_dataplus._M_p,
               err_msg._M_dataplus._M_p + err_msg._M_string_length);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)&this[-0x13].recomp_fn.super__Function_base._M_manager,&local_1d8,&local_1f8,
                 false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar9 = false;
LAB_001668ed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err_msg._M_dataplus._M_p != &err_msg.field_2) {
    operator_delete(err_msg._M_dataplus._M_p,
                    CONCAT71(err_msg.field_2._M_allocated_capacity._1_7_,
                             err_msg.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msgidea._M_dataplus._M_p != &msgidea.field_2) {
    operator_delete(msgidea._M_dataplus._M_p,
                    CONCAT71(msgidea.field_2._M_allocated_capacity._1_7_,
                             msgidea.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msgreal._M_dataplus._M_p != &msgreal.field_2) {
    operator_delete(msgreal._M_dataplus._M_p,
                    CONCAT71(msgreal.field_2._M_allocated_capacity._1_7_,
                             msgreal.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

bool CheckSolution(
        ArrayRef<double> x,
        const pre::ValueMapDbl& duals,   // unused
        ArrayRef<double> obj,
        void* p_extra) {
    bool fKnownInfeas = (bool)p_extra;
    if (fKnownInfeas && !MPCD( sol_check_infeas() ))
      return true;
    std::string msgreal, msgidea;
    std::string err_msg;
    try {                            // protect
      std::vector<double> x_back = x;
      if (MPCD( sol_check_mode() ) & (1+2+4+8+16)) {
        msgreal = DoCheckSol(x, duals, obj, {}, x_back, false);
      }
      if (MPCD( sol_check_mode() ) & (32+64+128+256+512)) {
        auto x1 = RecomputeAuxVars(x);
        msgidea = DoCheckSol(x1, duals, obj, x_back, x_back, true);
      }
      if (msgreal.size() || msgidea.size()) {     // Checks failed
        std::string warn
            = "Type                         MaxAbs [Name]   MaxRel [Name]\n";
        warn += msgidea;
        if (msgreal.size()) {
          for (auto i=msgreal.size()-1; i--; ) {
            if ('\n'==msgreal[i] && ' '==msgreal[i+1])
              msgreal[i+1] = '*';
          }
          if (' '==msgreal.front())
            msgreal.front() = '*';
          warn += msgreal;
          warn += "*: Using the solver's aux variable values.\n";
        }
        warn += "Documentation: mp.ampl.com/modeling-tools.html#automatic-solution-check.";
        // Should messages for realistic and idealistic
        // modes be more coordinated?
        // I.e., when no expressions.
        // What if this is an intermediate solution?
        // Should be fine - warning by default,
        // fail if requested explicitly.
        // If warning, we should add the report
        // to that solution's solve message, and
        // a summary in the final solve message.
        // For now, do this via warnings?
        if (MPCD( sol_check_fail() ))
          MP_RAISE_WITH_CODE(int(sol::MP_SOLUTION_CHECK),
                             "Solution check failed - reporting as fatal:\n"
                             + warn);
        else
          MPD( AddWarning(
                 MPD( GetEnv() ).GetSolCheckWarningKey(true),
                 warn,
                 true) );  // replace for multiple solutions
      }
    } catch (const mp::Error& err) {
      if (MPCD( sol_check_fail() ))
        throw;
      err_msg = err.what();
    } catch (const std::exception& exc) {
      err_msg = exc.what();
    } catch (...) {
      err_msg = "unknown error";
    }
    if (err_msg.size()) {
      err_msg += '\n' + msgreal + msgidea;
      if (MPCD( sol_check_fail() ))
        MP_RAISE("Solution check aborted: " + err_msg);
      MPD( AddWarning("Solution check aborted", err_msg) );
      return false;
    }
    return msgreal.empty() && msgidea.empty();
  }